

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  bool bVar1;
  int line;
  uint uVar2;
  ostream *poVar3;
  char *pcVar4;
  internal *piVar5;
  TestPartResult *this;
  int width;
  int width_00;
  int width_01;
  TimeInMillis ms;
  string local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  undefined1 local_2d8 [8];
  string message;
  string location;
  TestPartResult *part;
  int i;
  int failures;
  allocator local_261;
  string local_260;
  allocator local_239;
  string local_238;
  string local_218;
  allocator local_1f1;
  string local_1f0;
  allocator local_1c9;
  string local_1c8;
  allocator local_1a1;
  string local_1a0;
  allocator local_179;
  string local_178;
  allocator local_151;
  string local_150;
  allocator local_129;
  string local_128;
  allocator local_101;
  string local_100;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  string local_90;
  undefined1 local_70 [8];
  string kIndent;
  undefined1 local_48 [8];
  string kTestcase;
  TestResult *result;
  TestInfo *test_info_local;
  char *test_case_name_local;
  ostream *stream_local;
  
  kTestcase.field_2._8_8_ = TestInfo::result(test_info);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_48,"testcase",(allocator *)(kIndent.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(kIndent.field_2._M_local_buf + 0xf));
  Indent_abi_cxx11_((string *)local_70,(internal *)0xa,width);
  Indent_abi_cxx11_(&local_90,(internal *)0x8,width_00);
  poVar3 = std::operator<<(stream,(string *)&local_90);
  std::operator<<(poVar3,"{\n");
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"name",&local_b1);
  pcVar4 = TestInfo::name(test_info);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,pcVar4,&local_d9);
  OutputJsonKey(stream,(string *)local_48,&local_b0,&local_d8,(string *)local_70,true);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  pcVar4 = TestInfo::value_param(test_info);
  if (pcVar4 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"value_param",&local_101);
    pcVar4 = TestInfo::value_param(test_info);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_128,pcVar4,&local_129);
    OutputJsonKey(stream,(string *)local_48,&local_100,&local_128,(string *)local_70,true);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
  }
  pcVar4 = TestInfo::type_param(test_info);
  if (pcVar4 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_150,"type_param",&local_151);
    pcVar4 = TestInfo::type_param(test_info);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_178,pcVar4,&local_179);
    OutputJsonKey(stream,(string *)local_48,&local_150,&local_178,(string *)local_70,true);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a0,"status",&local_1a1);
  bVar1 = TestInfo::should_run(test_info);
  pcVar4 = "NOTRUN";
  if (bVar1) {
    pcVar4 = "RUN";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c8,pcVar4,&local_1c9);
  OutputJsonKey(stream,(string *)local_48,&local_1a0,&local_1c8,(string *)local_70,true);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f0,"time",&local_1f1);
  piVar5 = (internal *)TestResult::elapsed_time((TestResult *)kTestcase.field_2._8_8_);
  FormatTimeInMillisAsDuration_abi_cxx11_(&local_218,piVar5,ms);
  OutputJsonKey(stream,(string *)local_48,&local_1f0,&local_218,(string *)local_70,true);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_238,"classname",&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_260,test_case_name,&local_261);
  OutputJsonKey(stream,(string *)local_48,&local_238,&local_260,(string *)local_70,false);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  TestPropertiesAsJson((string *)&i,(TestResult *)kTestcase.field_2._8_8_,(string *)local_70);
  std::operator<<(stream,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  part._4_4_ = 0;
  for (part._0_4_ = 0; line = TestResult::total_part_count((TestResult *)kTestcase.field_2._8_8_),
      (int)part < line; part._0_4_ = (int)part + 1) {
    this = TestResult::GetTestPartResult((TestResult *)kTestcase.field_2._8_8_,(int)part);
    bVar1 = TestPartResult::failed(this);
    if (bVar1) {
      std::operator<<(stream,",\n");
      part._4_4_ = part._4_4_ + 1;
      if (part._4_4_ == 1) {
        poVar3 = std::operator<<(stream,(string *)local_70);
        poVar3 = std::operator<<(poVar3,"\"");
        poVar3 = std::operator<<(poVar3,"failures");
        std::operator<<(poVar3,"\": [\n");
      }
      piVar5 = (internal *)TestPartResult::file_name(this);
      uVar2 = TestPartResult::line_number(this);
      FormatCompilerIndependentFileLocation_abi_cxx11_
                ((string *)((long)&message.field_2 + 8),piVar5,(char *)(ulong)uVar2,line);
      std::operator+(&local_318,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&message.field_2 + 8),"\n");
      pcVar4 = TestPartResult::message(this);
      std::operator+(&local_2f8,&local_318,pcVar4);
      EscapeJson((string *)local_2d8,&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_318);
      poVar3 = std::operator<<(stream,(string *)local_70);
      poVar3 = std::operator<<(poVar3,"  {\n");
      poVar3 = std::operator<<(poVar3,(string *)local_70);
      poVar3 = std::operator<<(poVar3,"    \"failure\": \"");
      poVar3 = std::operator<<(poVar3,(string *)local_2d8);
      poVar3 = std::operator<<(poVar3,"\",\n");
      poVar3 = std::operator<<(poVar3,(string *)local_70);
      poVar3 = std::operator<<(poVar3,"    \"type\": \"\"\n");
      poVar3 = std::operator<<(poVar3,(string *)local_70);
      std::operator<<(poVar3,"  }");
      std::__cxx11::string::~string((string *)local_2d8);
      std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
    }
  }
  if (0 < part._4_4_) {
    poVar3 = std::operator<<(stream,"\n");
    poVar3 = std::operator<<(poVar3,(string *)local_70);
    std::operator<<(poVar3,"]");
  }
  poVar3 = std::operator<<(stream,"\n");
  Indent_abi_cxx11_(&local_338,(internal *)0x8,width_01);
  poVar3 = std::operator<<(poVar3,(string *)&local_338);
  std::operator<<(poVar3,"}");
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestInfo(::std::ostream* stream,
                                                   const char* test_case_name,
                                                   const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestcase = "testcase";
  const std::string kIndent = Indent(10);

  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, kTestcase, "name", test_info.name(), kIndent);

  if (test_info.value_param() != NULL) {
    OutputJsonKey(stream, kTestcase, "value_param",
                  test_info.value_param(), kIndent);
  }
  if (test_info.type_param() != NULL) {
    OutputJsonKey(stream, kTestcase, "type_param", test_info.type_param(),
                  kIndent);
  }

  OutputJsonKey(stream, kTestcase, "status",
                test_info.should_run() ? "RUN" : "NOTRUN", kIndent);
  OutputJsonKey(stream, kTestcase, "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()), kIndent);
  OutputJsonKey(stream, kTestcase, "classname", test_case_name, kIndent, false);
  *stream << TestPropertiesAsJson(result, kIndent);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      *stream << ",\n";
      if (++failures == 1) {
        *stream << kIndent << "\"" << "failures" << "\": [\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string message = EscapeJson(location + "\n" + part.message());
      *stream << kIndent << "  {\n"
              << kIndent << "    \"failure\": \"" << message << "\",\n"
              << kIndent << "    \"type\": \"\"\n"
              << kIndent << "  }";
    }
  }

  if (failures > 0)
    *stream << "\n" << kIndent << "]";
  *stream << "\n" << Indent(8) << "}";
}